

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
duckdb::TypeIdToString_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,PhysicalType type)

{
  char *pcVar1;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar1 = "BOOL";
    break;
  case 2:
    pcVar1 = "UINT8";
    break;
  case 3:
    pcVar1 = "INT8";
    break;
  case 4:
    pcVar1 = "UINT16";
    break;
  case 5:
    pcVar1 = "INT16";
    break;
  case 6:
    pcVar1 = "UINT32";
    break;
  case 7:
    pcVar1 = "INT32";
    break;
  case 8:
    pcVar1 = "UINT64";
    break;
  case 9:
    pcVar1 = "INT64";
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
switchD_017aaeb0_caseD_a:
    pcVar1 = "INVALID";
    break;
  case 0xb:
    pcVar1 = "FLOAT";
    break;
  case 0xc:
    pcVar1 = "DOUBLE";
    break;
  case 0x15:
    pcVar1 = "INTERVAL";
    break;
  case 0x17:
    pcVar1 = "LIST";
    break;
  case 0x18:
    pcVar1 = "STRUCT";
    break;
  case 0x1d:
    pcVar1 = "ARRAY";
    break;
  default:
    switch((int)this) {
    case 200:
      pcVar1 = "VARCHAR";
      break;
    default:
      goto switchD_017aaeb0_caseD_a;
    case 0xcb:
      pcVar1 = "UINT128";
      break;
    case 0xcc:
      pcVar1 = "INT128";
      break;
    case 0xcd:
      pcVar1 = "UNKNOWN";
      break;
    case 0xce:
      pcVar1 = "BIT";
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string TypeIdToString(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL:
		return "BOOL";
	case PhysicalType::INT8:
		return "INT8";
	case PhysicalType::INT16:
		return "INT16";
	case PhysicalType::INT32:
		return "INT32";
	case PhysicalType::INT64:
		return "INT64";
	case PhysicalType::UINT8:
		return "UINT8";
	case PhysicalType::UINT16:
		return "UINT16";
	case PhysicalType::UINT32:
		return "UINT32";
	case PhysicalType::UINT64:
		return "UINT64";
	case PhysicalType::INT128:
		return "INT128";
	case PhysicalType::UINT128:
		return "UINT128";
	case PhysicalType::FLOAT:
		return "FLOAT";
	case PhysicalType::DOUBLE:
		return "DOUBLE";
	case PhysicalType::VARCHAR:
		return "VARCHAR";
	case PhysicalType::INTERVAL:
		return "INTERVAL";
	case PhysicalType::STRUCT:
		return "STRUCT";
	case PhysicalType::LIST:
		return "LIST";
	case PhysicalType::ARRAY:
		return "ARRAY";
	case PhysicalType::INVALID:
		return "INVALID";
	case PhysicalType::BIT:
		return "BIT";
	case PhysicalType::UNKNOWN:
		return "UNKNOWN";
	}
	return "INVALID";
}